

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O1

Vector3d *
opengv::generateRandomDirectionTranslation(Vector3d *__return_storage_ptr__,double parallax)

{
  double dVar1;
  undefined1 auVar2 [16];
  ActualDstType actualDst;
  undefined1 auVar3 [16];
  Matrix3d rotation;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_40 [16];
  double local_30;
  undefined1 local_28 [16];
  double local_18;
  
  generateRandomRotation();
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = 1.0;
  *(undefined1 (*) [16])
   ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array + 1) = ZEXT816(0) << 0x40;
  auVar2 = vfmadd213pd_fma(local_40,ZEXT816(0) << 0x40,local_58);
  dVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2];
  auVar3._8_8_ = dVar1;
  auVar3._0_8_ = dVar1;
  auVar2 = vfmadd231pd_fma(auVar2,auVar3,local_28);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = parallax * auVar2._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = parallax * auVar2._8_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = (local_30 * 0.0 + dVar1 * local_18 + local_48) * parallax;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomDirectionTranslation( double parallax )
{
  Matrix3d rotation = generateRandomRotation();
  Vector3d translation;
  translation << 1.0, 0.0, 0.0;
  translation = rotation * translation;
  translation = parallax * translation;
  return translation;
}